

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::SplitData
          (ByteData *__return_storage_ptr__,ByteData *this,uint32_t size_from_top)

{
  initializer_list<unsigned_int> __l;
  ByteData *this_00;
  allocator_type *__a;
  allocator_type local_65;
  uint32_t local_64;
  iterator local_60;
  size_type local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined1 local_38 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> ret;
  uint32_t size_from_top_local;
  ByteData *this_local;
  
  local_60 = &local_64;
  local_58 = 1;
  __a = &local_65;
  this_00 = __return_storage_ptr__;
  local_64 = size_from_top;
  ret.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = size_from_top;
  ::std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x4019f2);
  __l._M_len = local_58;
  __l._M_array = local_60;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__l,__a);
  SplitData((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,this,
            &local_50);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  ::std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x401a2e);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_38,0);
  ByteData(this_00,__return_storage_ptr__);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)__a);
  return this_00;
}

Assistant:

ByteData ByteData::SplitData(uint32_t size_from_top) const {
  auto ret = SplitData(std::vector<uint32_t>{size_from_top});
  return ret[0];
}